

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
::operator()(arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
             *this,char_type *value)

{
  char cVar1;
  size_t in_RCX;
  void *in_RDX;
  arg_formatter_base<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>,_char>_>
  *local_18;
  char_type *local_10;
  
  if (this->specs_ != (format_specs *)0x0) {
    cVar1 = (this->specs_->super_core_format_specs).type;
    local_18 = this;
    local_10 = value;
    if (cVar1 != 's') {
      if (cVar1 == 'p') {
        write_pointer(this,value);
        goto LAB_001d397c;
      }
      if (cVar1 != '\0') {
        error_handler::on_error((error_handler *)&local_18,"invalid type specifier");
        goto LAB_001d397c;
      }
    }
  }
  write(this,(int)value,in_RDX,in_RCX);
LAB_001d397c:
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(const char_type *value) {
    if (!specs_) return write(value), out();
    internal::handle_cstring_type_spec(
          specs_->type, cstring_spec_handler(*this, value));
    return out();
  }